

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O3

void Vec_WecPush(Vec_Wec_t *p,int Level,int Entry)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  
  iVar7 = p->nSize;
  if (iVar7 <= Level) {
    iVar1 = Level + 1;
    iVar4 = iVar7 * 2;
    if (iVar7 * 2 <= iVar1) {
      iVar4 = iVar1;
    }
    iVar7 = p->nCap;
    if (iVar7 < iVar4) {
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar5 = (Vec_Int_t *)malloc((long)iVar4 << 4);
      }
      else {
        pVVar5 = (Vec_Int_t *)realloc(p->pArray,(long)iVar4 << 4);
        iVar7 = p->nCap;
      }
      p->pArray = pVVar5;
      memset(pVVar5 + iVar7,0,(long)(iVar4 - iVar7) << 4);
      p->nCap = iVar4;
    }
    p->nSize = iVar1;
    iVar7 = iVar1;
  }
  if ((Level < 0) || (iVar7 <= Level)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar3 = p->pArray;
  pVVar5 = pVVar3 + (uint)Level;
  uVar2 = pVVar3[(uint)Level].nSize;
  if (uVar2 == pVVar3[(uint)Level].nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar5->pArray == (int *)0x0) {
        piVar6 = (int *)malloc(0x40);
      }
      else {
        piVar6 = (int *)realloc(pVVar5->pArray,0x40);
      }
      pVVar5->pArray = piVar6;
      if (piVar6 == (int *)0x0) {
LAB_005802fc:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar5->nCap = 0x10;
    }
    else {
      if (pVVar5->pArray == (int *)0x0) {
        piVar6 = (int *)malloc((ulong)uVar2 * 8);
      }
      else {
        piVar6 = (int *)realloc(pVVar5->pArray,(ulong)uVar2 * 8);
      }
      pVVar5->pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_005802fc;
      pVVar5->nCap = uVar2 * 2;
    }
  }
  else {
    piVar6 = pVVar5->pArray;
  }
  iVar7 = pVVar5->nSize;
  pVVar5->nSize = iVar7 + 1;
  piVar6[iVar7] = Entry;
  return;
}

Assistant:

static inline void Vec_WecPush( Vec_Wec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        Vec_WecGrow( p, Abc_MaxInt(2*p->nSize, Level + 1) );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_WecEntry(p, Level), Entry );
}